

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeaderStructs.cpp
# Opt level: O1

istream * operator>>(istream *stream,TxaHeader *header)

{
  int iVar1;
  
  iVar1 = detectSwitch(stream);
  if (iVar1 < 0) {
    readTxa<TxaHeaderPS3>(stream,header);
  }
  else {
    readTxa<TxaHeaderSwitch>(stream,header);
  }
  return stream;
}

Assistant:

std::istream& operator>>(std::istream& stream, TxaHeader& header) {
	int version = detectSwitch(stream);
	if (version < 0) { // PS3
		readTxa<TxaHeaderPS3>(stream, header);
	} else { // Switch
		readTxa<TxaHeaderSwitch>(stream, header);
	}
	return stream;
}